

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ftrfork.c
# Opt level: O2

FT_Error raccess_guess_apple_generic
                   (FT_Library library,FT_Stream stream,char *base_file_name,FT_Int32 magic,
                   FT_Long *result_offset)

{
  FT_UInt16 FVar1;
  FT_UInt32 FVar2;
  FT_Error FVar3;
  undefined8 in_RAX;
  uint uVar4;
  bool bVar5;
  undefined4 uStack_38;
  FT_Error error;
  
  _uStack_38 = in_RAX;
  FVar2 = FT_Stream_ReadULong((FT_Stream)library,&error);
  if (error != 0) {
    return error;
  }
  if (FVar2 == (FT_UInt32)stream) {
    FT_Stream_ReadULong((FT_Stream)library,&error);
    if (error != 0) {
      return error;
    }
    FVar3 = FT_Stream_Skip((FT_Stream)library,0x10);
    if (FVar3 != 0) {
      return FVar3;
    }
    error = FVar3;
    FVar1 = FT_Stream_ReadUShort((FT_Stream)library,&error);
    if (error != 0) {
      return error;
    }
    if (FVar1 != 0) {
      uVar4 = (uint)FVar1;
      while (bVar5 = uVar4 != 0, uVar4 = uVar4 - 1, bVar5) {
        FVar2 = FT_Stream_ReadULong((FT_Stream)library,&error);
        if (error != 0) {
          return error;
        }
        if (FVar2 == 2) {
          FVar2 = FT_Stream_ReadULong((FT_Stream)library,&error);
          if ((error == 0) && (FT_Stream_ReadULong((FT_Stream)library,&error), error == 0)) {
            *(long *)base_file_name = (long)(int)FVar2;
            return 0;
          }
        }
        else {
          error = FT_Stream_Skip((FT_Stream)library,8);
          if (error != 0) {
            return error;
          }
        }
      }
    }
  }
  return 2;
}

Assistant:

static FT_Error
  raccess_guess_apple_generic( FT_Library  library,
                               FT_Stream   stream,
                               char       *base_file_name,
                               FT_Int32    magic,
                               FT_Long    *result_offset )
  {
    FT_Int32   magic_from_stream;
    FT_Error   error;
    FT_Int32   version_number = 0;
    FT_UShort  n_of_entries;

    int        i;
    FT_Int32   entry_id, entry_offset, entry_length = 0;

    const FT_Int32  resource_fork_entry_id = 0x2;

    FT_UNUSED( library );
    FT_UNUSED( base_file_name );
    FT_UNUSED( version_number );
    FT_UNUSED( entry_length   );


    if ( FT_READ_LONG( magic_from_stream ) )
      return error;
    if ( magic_from_stream != magic )
      return FT_THROW( Unknown_File_Format );

    if ( FT_READ_LONG( version_number ) )
      return error;

    /* filler */
    error = FT_Stream_Skip( stream, 16 );
    if ( error )
      return error;

    if ( FT_READ_USHORT( n_of_entries ) )
      return error;
    if ( n_of_entries == 0 )
      return FT_THROW( Unknown_File_Format );

    for ( i = 0; i < n_of_entries; i++ )
    {
      if ( FT_READ_LONG( entry_id ) )
        return error;
      if ( entry_id == resource_fork_entry_id )
      {
        if ( FT_READ_LONG( entry_offset ) ||
             FT_READ_LONG( entry_length ) )
          continue;
        *result_offset = entry_offset;

        return FT_Err_Ok;
      }
      else
      {
        error = FT_Stream_Skip( stream, 4 + 4 );    /* offset + length */
        if ( error )
          return error;
      }
    }

    return FT_THROW( Unknown_File_Format );
  }